

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_server_connection.c
# Opt level: O0

void json_server_connection_create
               (json_server_connection_t *self,msocket_t *msocket,apx_connection_tag *apx_connection
               )

{
  undefined1 local_50 [8];
  msocket_handler_t handler;
  apx_connection_tag *apx_connection_local;
  msocket_t *msocket_local;
  json_server_connection_t *self_local;
  
  if (((self != (json_server_connection_t *)0x0) && (msocket != (msocket_t *)0x0)) &&
     (apx_connection != (apx_connection_tag *)0x0)) {
    self->msocket = msocket;
    self->apx_connection = apx_connection;
    handler.tcp_inactivity = (_func_void_uint32_t *)apx_connection;
    memset(local_50,0,0x30);
    handler.tcp_disconnected = json_server_connection_data;
    handler.tcp_connected = json_server_connection_disconnected;
    msocket_set_handler(self->msocket,local_50,self);
  }
  return;
}

Assistant:

void json_server_connection_create(json_server_connection_t *self, msocket_t *msocket, struct apx_connection_tag *apx_connection)
{
   if ( (self != 0) && (msocket != 0) && (apx_connection != 0) )
   {
      msocket_handler_t handler;
      self->msocket = msocket;
      self->apx_connection = apx_connection;
      memset(&handler, 0, sizeof(msocket_handler_t));
      handler.tcp_data = json_server_connection_data;
      handler.tcp_disconnected = json_server_connection_disconnected;
      msocket_sethandler(self->msocket, &handler, (void*) self);
   }
}